

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

void printKTXInfo2(ktxStream *stream,KTX_header *pHeader)

{
  ktx_uint32_t kVar1;
  bool bVar2;
  ktx_error_code_e kVar3;
  ktx_uint8_t *pKvd;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ktx_uint32_t faceLodSize;
  KTX_supplemental_info suppInfo;
  uint local_38;
  KTX_supplemental_info local_34;
  
  if (pHeader->endianness == 0x1020304) {
    pcVar7 = 
    "This file has opposite endianness to this machine. Following\nare the converted pHeader values\n\n"
    ;
    sVar6 = 0x5f;
  }
  else {
    pcVar7 = "Header\n\n";
    sVar6 = 8;
  }
  fwrite(pcVar7,sVar6,1,_stdout);
  printKTXHeader(pHeader);
  kVar3 = ktxCheckHeader1_(pHeader,&local_34);
  if (kVar3 == KTX_SUCCESS) {
    if (pHeader->bytesOfKeyValueData == 0) {
      fwrite("\nNo Key/Value data.\n",0x14,1,_stdout);
    }
    else {
      fwrite("\nKey/Value Data\n\n",0x11,1,_stdout);
      uVar4 = pHeader->bytesOfKeyValueData;
      pKvd = (ktx_uint8_t *)malloc((ulong)uVar4);
      (*stream->read)(stream,pKvd,(ulong)uVar4);
      printKVData(pKvd,pHeader->bytesOfKeyValueData);
      free(pKvd);
    }
    kVar1 = pHeader->numberOfMipLevels;
    if ((pHeader->numberOfArrayElements != 0) || (bVar2 = true, pHeader->numberOfFaces != 6)) {
      bVar2 = false;
    }
    fwrite("\nData Sizes (bytes)\n------------------\n",0x27,1,_stdout);
    uVar5 = 0;
    lVar9 = 0;
    do {
      (*stream->read)(stream,&local_38,4);
      if (pHeader->endianness == 0x1020304) {
        _ktxSwapEndian32(&local_38,1);
      }
      uVar4 = local_38 * 6;
      if (!bVar2) {
        uVar4 = local_38;
      }
      uVar8 = (ulong)uVar4;
      (*stream->skip)(stream,uVar8);
      lVar9 = lVar9 + uVar8;
      fprintf(_stdout,"Level %u: %u\n",uVar5,uVar8);
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (kVar1 + (kVar1 == 0) != uVar4);
    fprintf(_stdout,"\nTotal: %ld\n",lVar9);
  }
  else {
    fwrite("The KTX 1 file pHeader is invalid:\n",0x23,1,_stdout);
    if (kVar3 == KTX_UNSUPPORTED_FEATURE) {
      pcVar7 = "  it describes an unsupported feature or format\n";
      sVar6 = 0x30;
    }
    else {
      if (kVar3 != KTX_FILE_DATA_ERROR) {
        return;
      }
      pcVar7 = 
      "  it has invalid data such as bad glTypeSize, improper dimensions,\nimproper number of faces or too many levels.\n"
      ;
      sVar6 = 0x70;
    }
    fwrite(pcVar7,sVar6,1,_stdout);
  }
  return;
}

Assistant:

void
printKTXInfo2(ktxStream* stream, KTX_header* pHeader)
{
    ktx_uint8_t* metadata;
    KTX_supplemental_info suppInfo;
    KTX_error_code result;

    if (pHeader->endianness == KTX_ENDIAN_REF_REV) {
        fprintf(stdout, "This file has opposite endianness to this machine. Following\n"
                        "are the converted pHeader values\n\n");
    } else {
        fprintf(stdout, "Header\n\n");
    }
    // Print first as ktxCheckHeader1_ modifies the header.
    printKTXHeader(pHeader);

    result = ktxCheckHeader1_(pHeader, &suppInfo);
    if (result != KTX_SUCCESS) {
        fprintf(stdout, "The KTX 1 file pHeader is invalid:\n");
        switch (result) {
          case KTX_FILE_DATA_ERROR:
            fprintf(stdout, "  it has invalid data such as bad glTypeSize, improper dimensions,\n"
                            "improper number of faces or too many levels.\n");
            break;
          case KTX_UNSUPPORTED_FEATURE:
            fprintf(stdout, "  it describes an unsupported feature or format\n");
            break;
          default:
              ; // _ktxCheckHeader returns only the above 2 errors.
        }
        return;
    }

    if (pHeader->bytesOfKeyValueData) {
        fprintf(stdout, "\nKey/Value Data\n\n");
        metadata = malloc(pHeader->bytesOfKeyValueData);
        stream->read(stream, metadata, pHeader->bytesOfKeyValueData);
        printKVData(metadata, pHeader->bytesOfKeyValueData);
        free(metadata);
    } else {
        fprintf(stdout, "\nNo Key/Value data.\n");
    }

    uint32_t levelCount = MAX(1, pHeader->numberOfMipLevels);
    bool nonArrayCubemap;
    if (pHeader->numberOfArrayElements == 0 && pHeader->numberOfFaces == 6)
        nonArrayCubemap = true;
    else
        nonArrayCubemap = false;
    ktx_uint64_t dataSize = 0;
    // A note about padding: Since KTX requires a row alignment of 4 for
    // uncompressed and all block-compressed formats have block sizes that
    // are a multiple of 4, all levels and faces will also be a multiple
    // of 4 so mipPadding and facePadding will always be 0. So they are
    // ignored here.
    fprintf(stdout, "\nData Sizes (bytes)\n------------------\n");
    for (uint32_t level = 0; level < levelCount; level++) {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t lodSize;
        result = stream->read(stream, &faceLodSize, sizeof(ktx_uint32_t));
        if (pHeader->endianness == KTX_ENDIAN_REF_REV)
            _ktxSwapEndian32(&faceLodSize, 1);
        if (nonArrayCubemap) {
            lodSize = faceLodSize * 6;
        } else {
            lodSize = faceLodSize;
        }
        result = stream->skip(stream, lodSize);
        dataSize += lodSize;
        fprintf(stdout, "Level %u: %u\n", level, lodSize);
    }
    fprintf(stdout, "\nTotal: %" PRId64 "\n", dataSize);
}